

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_short,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  uint *puVar1;
  uint *puVar2;
  float fVar3;
  byte bVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  uint *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  
  bVar4 = (k->res).ulog2;
  iVar13 = nTxChan << (bVar4 & 0x1f);
  lVar7 = (long)iVar13 * (long)k->vw;
  if ((int)lVar7 != 0) {
    puVar9 = (uint *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 2);
    puVar1 = (uint *)((long)puVar9 + lVar7 * 2);
    pfVar5 = k->ku;
    pfVar8 = k->kv;
    lVar12 = (long)nTxChan;
    lVar11 = k->uw * lVar12;
    iVar10 = (int)lVar11;
    lVar7 = lVar12 * 2;
    do {
      fVar16 = *pfVar5;
      fVar15 = fVar16 * (float)(*puVar9 & 0xffff);
      fVar16 = fVar16 * (float)(*puVar9 >> 0x10);
      lVar14 = lVar11 * 2;
      pfVar6 = pfVar5;
      if (iVar10 != nTxChan) {
        do {
          puVar2 = (uint *)((long)puVar9 + lVar7);
          puVar9 = (uint *)((long)puVar9 + lVar7);
          fVar3 = pfVar6[1];
          fVar15 = fVar15 + fVar3 * (float)(*puVar2 & 0xffff);
          fVar16 = fVar16 + fVar3 * (float)(*puVar2 >> 0x10);
          lVar14 = lVar14 + lVar12 * -2;
          pfVar6 = pfVar6 + 1;
        } while (lVar7 != lVar14);
      }
      fVar3 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *(ulong *)result =
           CONCAT44(fVar3 * fVar16 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar3 * fVar15 + (float)*(undefined8 *)result);
      puVar9 = (uint *)((long)puVar9 + (long)(iVar13 - iVar10) * 2 + lVar12 * 2);
    } while (puVar9 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }